

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_dbg.c
# Opt level: O0

_Bool ecs_dbg_match_entity
                (ecs_world_t *world,ecs_entity_t entity,ecs_entity_t system,
                ecs_match_failure_t *failure_info_out)

{
  void *pvVar1;
  EcsSystem *system_data;
  ecs_dbg_entity_t dbg;
  ecs_match_failure_t *failure_info_out_local;
  ecs_entity_t system_local;
  ecs_entity_t entity_local;
  ecs_world_t *world_local;
  
  dbg._24_8_ = failure_info_out;
  ecs_dbg_entity(world,entity,(ecs_dbg_entity_t *)&system_data);
  pvVar1 = ecs_get_w_entity(world,system,5);
  if (pvVar1 == (void *)0x0) {
    *(undefined4 *)dbg._24_8_ = 1;
    *(undefined4 *)(dbg._24_8_ + 4) = 0xffffffff;
    world_local._7_1_ = false;
  }
  else {
    world_local._7_1_ =
         ecs_query_match(world,(ecs_table_t *)dbg.entity,*(ecs_query_t **)((long)pvVar1 + 0x18),
                         (ecs_match_failure_t *)dbg._24_8_);
  }
  return world_local._7_1_;
}

Assistant:

bool ecs_dbg_match_entity(
    ecs_world_t *world,
    ecs_entity_t entity,
    ecs_entity_t system,
    ecs_match_failure_t *failure_info_out)
{
    ecs_dbg_entity_t dbg;
    ecs_dbg_entity(world, entity, &dbg);

    const EcsSystem *system_data = ecs_get(world, system, EcsSystem);
    if (!system_data) {
        failure_info_out->reason = EcsMatchNotASystem;
        failure_info_out->column = -1;
        return false;
    }

    return ecs_query_match(
        world, dbg.table, system_data->query, failure_info_out);
}